

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm.c
# Opt level: O0

void easm_del_subinsn(easm_subinsn *subinsn)

{
  int local_14;
  int i;
  easm_subinsn *subinsn_local;
  
  if (subinsn != (easm_subinsn *)0x0) {
    for (local_14 = 0; local_14 < subinsn->prefsnum; local_14 = local_14 + 1) {
      easm_del_expr(subinsn->prefs[local_14]);
    }
    free(subinsn->prefs);
    easm_del_sinsn(subinsn->sinsn);
    free(subinsn);
  }
  return;
}

Assistant:

void easm_del_subinsn(struct easm_subinsn *subinsn) {
	if (!subinsn) return;
	int i;
	for (i = 0; i < subinsn->prefsnum; i++)
		easm_del_expr(subinsn->prefs[i]);
	free(subinsn->prefs);
	easm_del_sinsn(subinsn->sinsn);
	free(subinsn);
}